

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Minisat::Clause::strengthen(Clause *this,Lit p)

{
  Clause *this_local;
  Lit p_local;
  
  this_local._4_4_ = p.x;
  remove<Minisat::Clause,Minisat::Lit>(this,(Lit *)((long)&this_local + 4));
  calcAbstraction(this);
  return;
}

Assistant:

inline void Clause::strengthen(Lit p)
{
    remove(*this, p);
    calcAbstraction();
}